

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

deUint32 deqp::gles31::Functional::anon_unknown_0::getTextureFormat(DataType samplerType)

{
  undefined4 local_c;
  DataType samplerType_local;
  
  if ((samplerType - TYPE_SAMPLER_1D < 3) || (samplerType - TYPE_SAMPLER_2D_ARRAY < 2)) {
    local_c = 0x8058;
  }
  else if ((samplerType - TYPE_INT_SAMPLER_1D < 3) || (samplerType - TYPE_INT_SAMPLER_2D_ARRAY < 2))
  {
    local_c = 0x8d8e;
  }
  else if ((samplerType - TYPE_UINT_SAMPLER_1D < 3) ||
          (samplerType - TYPE_UINT_SAMPLER_2D_ARRAY < 2)) {
    local_c = 0x8d7c;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

deUint32 getTextureFormat (glu::DataType samplerType)
{
	using namespace glu;

	switch (samplerType)
	{
		case TYPE_SAMPLER_1D:
		case TYPE_SAMPLER_2D:
		case TYPE_SAMPLER_CUBE:
		case TYPE_SAMPLER_2D_ARRAY:
		case TYPE_SAMPLER_3D:
			return GL_RGBA8;

		case TYPE_INT_SAMPLER_1D:
		case TYPE_INT_SAMPLER_2D:
		case TYPE_INT_SAMPLER_CUBE:
		case TYPE_INT_SAMPLER_2D_ARRAY:
		case TYPE_INT_SAMPLER_3D:
			return GL_RGBA8I;

		case TYPE_UINT_SAMPLER_1D:
		case TYPE_UINT_SAMPLER_2D:
		case TYPE_UINT_SAMPLER_CUBE:
		case TYPE_UINT_SAMPLER_2D_ARRAY:
		case TYPE_UINT_SAMPLER_3D:
			return GL_RGBA8UI;

		default:
			DE_FATAL("Unsupported (sampler) type");
			return 0;
	}
}